

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void EmitFileEntry(raw_ostream *OS,File *File)

{
  size_t in_RCX;
  void *__buf;
  
  llvm::raw_ostream::write(OS,(int)(File->Name).Data,(void *)(File->Name).Length,in_RCX);
  llvm::raw_ostream::write(OS,0,__buf,in_RCX);
  llvm::encodeULEB128(File->DirIdx,OS,0);
  llvm::encodeULEB128(File->ModTime,OS,0);
  llvm::encodeULEB128(File->Length,OS,0);
  return;
}

Assistant:

static void EmitFileEntry(raw_ostream &OS, const DWARFYAML::File &File) {
  OS.write(File.Name.data(), File.Name.size());
  OS.write('\0');
  encodeULEB128(File.DirIdx, OS);
  encodeULEB128(File.ModTime, OS);
  encodeULEB128(File.Length, OS);
}